

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O2

int filterResources(int *resourceList,int resourceCount,long preferenceFlags,long requirementFlags,
                   PairedList *possibleResources)

{
  _List_node_base *__filename;
  uint uVar1;
  int iVar2;
  long lVar3;
  _Self __tmp;
  long lVar4;
  _List_node_base *p_Var5;
  long lVar6;
  ulong uVar7;
  value_type local_40;
  ulong local_38;
  
  local_38 = requirementFlags;
  if (resourceList == (int *)0x0 || resourceCount == 0) {
    lVar6 = 0x10;
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < rsrcList->length; lVar4 = lVar4 + 1) {
      uVar1 = scoreFlags(preferenceFlags,*(long *)((long)&rsrcList->list->name + lVar6));
      local_40 = (value_type)((ulong)uVar1 + lVar3);
      std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                (possibleResources,&local_40);
      lVar6 = lVar6 + 0x20;
      lVar3 = lVar3 + 0x100000000;
    }
  }
  else {
    for (uVar7 = 0; (uint)(~(resourceCount >> 0x1f) & resourceCount) != uVar7; uVar7 = uVar7 + 1) {
      iVar2 = resourceList[uVar7];
      local_40.first = scoreFlags(preferenceFlags,rsrcList->list[iVar2].supportFlags);
      local_40.second = iVar2;
      std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                (possibleResources,&local_40);
    }
  }
  uVar7 = local_38;
  p_Var5 = (_List_node_base *)possibleResources;
  if (local_38 != 0) {
    do {
      p_Var5 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var5 == (_List_node_base *)possibleResources) break;
      if ((long)(rsrcList->list[*(int *)((long)&p_Var5[1]._M_next + 4)].supportFlags & uVar7) <
          (long)uVar7) {
        __filename = p_Var5 + 1;
        if (p_Var5 == (possibleResources->
                      super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                      _M_impl._M_node.super__List_node_base._M_next) {
          std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::remove
                    (possibleResources,(char *)__filename);
          p_Var5 = (possibleResources->
                   super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl._M_node.super__List_node_base._M_next;
        }
        else {
          p_Var5 = p_Var5->_M_prev;
          std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::remove
                    (possibleResources,(char *)__filename);
        }
      }
    } while (p_Var5 != (_List_node_base *)possibleResources);
  }
  iVar2 = -6;
  if ((possibleResources->
      super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl._M_node.
      _M_size != 0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int filterResources(int* resourceList,
                    int resourceCount,
                    long preferenceFlags,
                    long requirementFlags,
                    PairedList* possibleResources) {

    // First determine a list of possible resources
    if (resourceList == NULL || resourceCount == 0) { // No list given
        for(int i=0; i<rsrcList->length; i++)
            possibleResources->push_back(std::make_pair(
                scoreFlags(preferenceFlags,rsrcList->list[i].supportFlags), // Score
                i)); // ID
    } else {
        for(int i=0; i<resourceCount; i++)
            possibleResources->push_back(std::make_pair(
                scoreFlags(preferenceFlags,rsrcList->list[resourceList[i]].supportFlags), // Score
                resourceList[i])); // ID
    }

    if (requirementFlags != 0) { // If requirements given do restriction
        for(PairedList::iterator it = possibleResources->begin();
            it != possibleResources->end(); ++it) {
            int resource = (*it).second;
            long resourceFlag = rsrcList->list[resource].supportFlags;
            if ( (resourceFlag & requirementFlags) < requirementFlags) {
                if(it==possibleResources->begin()){
                    possibleResources->remove(*(it));
                    it=possibleResources->begin();
                }else
                    possibleResources->remove(*(it--));
            }
            if(it==possibleResources->end())
                break;
        }
    }

    if (possibleResources->size() == 0) {
        return BEAGLE_ERROR_NO_RESOURCE;
    }

    return BEAGLE_SUCCESS;
}